

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O0

int32_t icu_63::number::impl::NumberFormatterImpl::writeAffixes
                  (MicroProps *micros,NumberStringBuilder *string,int32_t start,int32_t end,
                  UErrorCode *status)

{
  bool bVar1;
  int iVar2;
  int32_t iVar3;
  int iVar4;
  int local_2c;
  int32_t length;
  UErrorCode *status_local;
  int32_t end_local;
  int32_t start_local;
  NumberStringBuilder *string_local;
  MicroProps *micros_local;
  
  iVar2 = (*micros->modInner->_vptr_Modifier[2])
                    (micros->modInner,string,(ulong)(uint)start,(ulong)(uint)end,status);
  bVar1 = Padder::isValid(&micros->padding);
  if (bVar1) {
    iVar3 = Padder::padAndApply(&micros->padding,micros->modMiddle,micros->modOuter,string,start,
                                iVar2 + end,status);
    local_2c = iVar3 + iVar2;
  }
  else {
    iVar4 = (*micros->modMiddle->_vptr_Modifier[2])
                      (micros->modMiddle,string,(ulong)(uint)start,(ulong)(uint)(iVar2 + end),status
                      );
    local_2c = (*micros->modOuter->_vptr_Modifier[2])
                         (micros->modOuter,string,(ulong)(uint)start,
                          (ulong)(uint)(iVar4 + iVar2 + end),status);
    local_2c = local_2c + iVar4 + iVar2;
  }
  return local_2c;
}

Assistant:

int32_t NumberFormatterImpl::writeAffixes(const MicroProps& micros, NumberStringBuilder& string,
                                          int32_t start, int32_t end, UErrorCode& status) {
    // Always apply the inner modifier (which is "strong").
    int32_t length = micros.modInner->apply(string, start, end, status);
    if (micros.padding.isValid()) {
        length += micros.padding
                .padAndApply(*micros.modMiddle, *micros.modOuter, string, start, length + end, status);
    } else {
        length += micros.modMiddle->apply(string, start, length + end, status);
        length += micros.modOuter->apply(string, start, length + end, status);
    }
    return length;
}